

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  sexp psVar5;
  int *piVar6;
  sexp_conflict psVar7;
  sexp_conflict local_80;
  sexp_conflict tmp;
  sexp_conflict name;
  long local_68;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  name = (sexp_conflict)0x43e;
  tmp = (sexp_conflict)0x43e;
  local_80 = (sexp_conflict)0x43e;
  iVar2 = strcmp(version,"0.11.0");
  psVar7 = (sexp_conflict)0xb3e;
  if (iVar2 == 0) {
    iVar2 = strncmp(abi,"cv-gm*uh",8);
    if (iVar2 == 0) {
      local_60.var = &name;
      local_40.next = &local_60;
      local_60.next = (ctx->value).context.saves;
      local_40.var = &tmp;
      local_50.next = &local_40;
      local_50.var = &local_80;
      (ctx->value).context.saves = &local_50;
      name = (sexp_conflict)sexp_c_string(ctx,"group",0xffffffffffffffff);
      lVar3 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar3);
      lVar1 = lVar3 + 0x18;
      *(undefined8 *)(lVar3 + 0x18) = 0x23e;
      uVar4 = sexp_intern(ctx,"gr_gid",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"gr_passwd",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"gr_name",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_make_vector_op(ctx,0,2,7,0x3e);
      *(undefined8 *)(lVar3 + 0x20) = uVar4;
      uVar4 = sexp_make_vector_op(ctx,0,2,7,0x3e);
      *(undefined8 *)(lVar3 + 0x28) = uVar4;
      local_68 = lVar3;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar3);
      name = (sexp_conflict)sexp_intern(ctx,"group?",6);
      sexp_env_define(ctx,env,name,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"passwd",0xffffffffffffffff);
      lVar3 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar3);
      lVar1 = lVar3 + 0x18;
      *(undefined8 *)(lVar3 + 0x18) = 0x23e;
      uVar4 = sexp_intern(ctx,"pw_shell",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_dir",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_gecos",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_gid",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_uid",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_passwd",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_intern(ctx,"pw_name",0xffffffffffffffff);
      sexp_push_op(ctx,lVar1,uVar4);
      uVar4 = sexp_make_vector_op(ctx,0,2,0xf,0x3e);
      *(undefined8 *)(lVar3 + 0x20) = uVar4;
      uVar4 = sexp_make_vector_op(ctx,0,2,0xf,0x3e);
      *(undefined8 *)(lVar3 + 0x28) = uVar4;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name);
      name = (sexp_conflict)sexp_intern(ctx,"user?",5);
      sexp_env_define(ctx,env,name,tmp);
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-shell",1,0,"sexp_passwd_get_pw_shell",
                            sexp_passwd_get_pw_shell,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 0x10) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-home",1,0,"sexp_passwd_get_pw_dir",sexp_passwd_get_pw_dir,
                            0);
      lVar1 = local_68;
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 0xe) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-gecos",1,0,"sexp_passwd_get_pw_gecos",
                            sexp_passwd_get_pw_gecos,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 0xc) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-group-id",1,0,"sexp_passwd_get_pw_gid",
                            sexp_passwd_get_pw_gid,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 10) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-id",1,0,"sexp_passwd_get_pw_uid",sexp_passwd_get_pw_uid,0)
      ;
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 8) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-password",1,0,"sexp_passwd_get_pw_passwd",
                            sexp_passwd_get_pw_passwd,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 6) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"user-name",1,0,"sexp_passwd_get_pw_name",
                            sexp_passwd_get_pw_name,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar3 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 4) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"group-id",1,0,"sexp_group_get_gr_gid",sexp_group_get_gr_gid,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar1 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 8) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"group-password",1,0,"sexp_group_get_gr_passwd",
                            sexp_group_get_gr_passwd,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar1 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 6) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"group-name",1,0,"sexp_group_get_gr_name",sexp_group_get_gr_name
                            ,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 0x13;
        (local_80->value).type.id = (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
      }
      piVar6 = *(int **)(lVar1 + 0x20);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
        *(sexp_conflict *)(piVar6 + 4) = local_80;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"getgrnam-safe",2,0,"sexp_getgrnam_safe_stub",
                            sexp_getgrnam_safe_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x13;
        (local_80->value).type.print = (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
        (local_80->value).port.line = 0x13;
        psVar5 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (local_80->value).type.finalize_name = psVar5;
        (psVar5->value).string.offset = 5;
        (((local_80->value).type.finalize_name)->value).type.slots =
             (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"getgrgid-safe",2,0,"sexp_getgrgid_safe_stub",
                            sexp_getgrgid_safe_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
        (local_80->value).type.print = (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
        (local_80->value).port.line = 0x13;
        psVar5 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (local_80->value).type.finalize_name = psVar5;
        (psVar5->value).string.offset = 5;
        (((local_80->value).type.finalize_name)->value).type.slots =
             (sexp)((ulong)*(uint *)(lVar1 + 0x50) * 2 + 1);
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"getpwnam_r",2,0,"sexp_getpwnam_r_stub",sexp_getpwnam_r_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x13;
        (local_80->value).type.print = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        (local_80->value).port.line = 0x13;
        psVar5 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (local_80->value).type.finalize_name = psVar5;
        (psVar5->value).string.offset = 5;
        (((local_80->value).type.finalize_name)->value).type.slots =
             (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"getpwuid_r",2,0,"sexp_getpwuid_r_stub",sexp_getpwuid_r_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
        (local_80->value).type.print = (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
        (local_80->value).port.line = 0x13;
        psVar5 = (sexp)sexp_make_vector_op(ctx,0,2,5,1);
        (local_80->value).type.finalize_name = psVar5;
        (psVar5->value).string.offset = 5;
        (((local_80->value).type.finalize_name)->value).type.slots =
             (sexp)((ulong)*(uint *)(lVar3 + 0x50) * 2 + 1);
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"set-root-directory!",1,0,"sexp_set_root_directory_x_stub",
                            sexp_set_root_directory_x_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x13;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"create-session",0,0,"sexp_create_session_stub",
                            sexp_create_session_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
      }
      uVar4 = sexp_make_integer(ctx,0,0);
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"current-session-id",1,1,"sexp_current_session_id_stub",
                            sexp_current_session_id_stub,uVar4);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
        (local_80->value).type.id = (sexp)0x5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"set-current-effective-group-id!",1,0,
                            "sexp_set_current_effective_group_id_x_stub",
                            sexp_set_current_effective_group_id_x_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"set-current-group-id!",1,0,"sexp_set_current_group_id_x_stub",
                            sexp_set_current_group_id_x_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"set-current-effective-user-id!",1,0,
                            "sexp_set_current_effective_user_id_x_stub",
                            sexp_set_current_effective_user_id_x_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"set-current-user-id!",1,0,"sexp_set_current_user_id_x_stub",
                            sexp_set_current_user_id_x_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 1;
        (local_80->value).type.id = (sexp)0x5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"current-effective-group-id",0,0,
                            "sexp_current_effective_group_id_stub",
                            sexp_current_effective_group_id_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"current-effective-user-id",0,0,
                            "sexp_current_effective_user_id_stub",
                            sexp_current_effective_user_id_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"current-group-id",0,0,"sexp_current_group_id_stub",
                            sexp_current_group_id_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
      }
      local_80 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"current-user-id",0,0,"sexp_current_user_id_stub",
                            sexp_current_user_id_stub,0);
      if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 0x1b)) {
        (local_80->value).bytecode.max_depth = 5;
      }
      piVar6 = (int *)sexp_define_foreign_aux
                                (ctx,env,"get-host-name",0,0,"sexp_get_host_name_stub",
                                 sexp_get_host_name_stub,0);
      if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 0x1b)) {
        piVar6[10] = 1;
        piVar6[0xb] = 0;
        piVar6[0xc] = 9;
        piVar6[0xd] = 0;
        piVar6[0xe] = 5;
        piVar6[0xf] = 0;
      }
      (ctx->value).context.saves = local_60.next;
      psVar7 = (sexp_conflict)0x43e;
    }
  }
  return psVar7;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_group_type_obj;
  sexp sexp_passwd_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_c_string(ctx, "group", -1);
  sexp_group_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_group_type_obj);
  sexp_type_slots(sexp_group_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_gid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_passwd", -1));
  sexp_push(ctx, sexp_type_slots(sexp_group_type_obj), sexp_intern(ctx, "gr_name", -1));
  sexp_type_getters(sexp_group_type_obj) = sexp_make_vector(ctx, SEXP_THREE, SEXP_FALSE);
  sexp_type_setters(sexp_group_type_obj) = sexp_make_vector(ctx, SEXP_THREE, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_group_type_obj);
  name = sexp_intern(ctx, "group?", 6);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "passwd", -1);
  sexp_passwd_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_passwd_type_obj);
  sexp_type_slots(sexp_passwd_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_shell", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_dir", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_gecos", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_gid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_uid", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_passwd", -1));
  sexp_push(ctx, sexp_type_slots(sexp_passwd_type_obj), sexp_intern(ctx, "pw_name", -1));
  sexp_type_getters(sexp_passwd_type_obj) = sexp_make_vector(ctx, SEXP_SEVEN, SEXP_FALSE);
  sexp_type_setters(sexp_passwd_type_obj) = sexp_make_vector(ctx, SEXP_SEVEN, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_passwd_type_obj);
  name = sexp_intern(ctx, "user?", 5);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "user-shell", 1, sexp_passwd_get_pw_shell);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_SIX, op);
  op = sexp_define_foreign(ctx, env, "user-home", 1, sexp_passwd_get_pw_dir);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_FIVE, op);
  op = sexp_define_foreign(ctx, env, "user-gecos", 1, sexp_passwd_get_pw_gecos);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_FOUR, op);
  op = sexp_define_foreign(ctx, env, "user-group-id", 1, sexp_passwd_get_pw_gid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "user-id", 1, sexp_passwd_get_pw_uid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "user-password", 1, sexp_passwd_get_pw_passwd);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "user-name", 1, sexp_passwd_get_pw_name);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_passwd_type_obj))) sexp_vector_set(sexp_type_getters(sexp_passwd_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "group-id", 1, sexp_group_get_gr_gid);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "group-password", 1, sexp_group_get_gr_passwd);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "group-name", 1, sexp_group_get_gr_name);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_group_type_obj))) sexp_vector_set(sexp_type_getters(sexp_group_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "getgrnam-safe", 2, sexp_getgrnam_safe_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getgrgid-safe", 2, sexp_getgrgid_safe_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_group_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getpwnam_r", 2, sexp_getpwnam_r_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "getpwuid_r", 2, sexp_getpwuid_r_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(sexp_type_tag(sexp_passwd_type_obj)));
  }
  op = sexp_define_foreign(ctx, env, "set-root-directory!", 1, sexp_set_root_directory_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
  }
  op = sexp_define_foreign(ctx, env, "create-session", 0, sexp_create_session_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign_opt(ctx, env, "current-session-id", 1, sexp_current_session_id_stub, sexp_make_integer(ctx, 0));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-effective-group-id!", 1, sexp_set_current_effective_group_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-group-id!", 1, sexp_set_current_group_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-effective-user-id!", 1, sexp_set_current_effective_user_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-current-user-id!", 1, sexp_set_current_user_id_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-effective-group-id", 0, sexp_current_effective_group_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-effective-user-id", 0, sexp_current_effective_user_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-group-id", 0, sexp_current_group_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "current-user-id", 0, sexp_current_user_id_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "get-host-name", 0, sexp_get_host_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_CHAR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}